

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O3

void __thiscall prevector_tests::prevector_tester<8U,_int>::move(prevector_tester<8U,_int> *this)

{
  long lVar1;
  pointer piVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_type sVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<int,_std::allocator<int>_>::_M_move_assign();
  piVar2 = (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->real_vector_alt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  if (8 < (this->pre_vector)._size) {
    free((this->pre_vector)._union.indirect_contents.indirect);
  }
  uVar3 = *(undefined4 *)&(this->pre_vector_alt)._union;
  uVar4 = *(undefined4 *)((long)&(this->pre_vector_alt)._union + 4);
  sVar5 = (this->pre_vector_alt)._union.indirect_contents.capacity;
  uVar6 = *(undefined4 *)((long)&(this->pre_vector_alt)._union + 0xc);
  uVar7 = *(undefined4 *)((long)&(this->pre_vector_alt)._union + 0x14);
  uVar8 = *(undefined4 *)((long)&(this->pre_vector_alt)._union + 0x18);
  uVar9 = *(undefined4 *)((long)&(this->pre_vector_alt)._union + 0x1c);
  *(undefined4 *)((long)&(this->pre_vector)._union + 0x10) =
       *(undefined4 *)((long)&(this->pre_vector_alt)._union + 0x10);
  *(undefined4 *)((long)&(this->pre_vector)._union + 0x14) = uVar7;
  *(undefined4 *)((long)&(this->pre_vector)._union + 0x18) = uVar8;
  *(undefined4 *)((long)&(this->pre_vector)._union + 0x1c) = uVar9;
  *(undefined4 *)&(this->pre_vector)._union = uVar3;
  *(undefined4 *)((long)&(this->pre_vector)._union + 4) = uVar4;
  (this->pre_vector)._union.indirect_contents.capacity = sVar5;
  *(undefined4 *)((long)&(this->pre_vector)._union + 0xc) = uVar6;
  (this->pre_vector)._size = (this->pre_vector_alt)._size;
  (this->pre_vector_alt)._size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    prevector<8U,_int,_unsigned_int,_int>::resize(&this->pre_vector_alt,0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void move() {
        real_vector = std::move(real_vector_alt);
        real_vector_alt.clear();
        pre_vector = std::move(pre_vector_alt);
        pre_vector_alt.clear();
    }